

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.cpp
# Opt level: O0

byte * __thiscall
slang::BumpAllocator::allocateSlow(BumpAllocator *this,size_t size,size_t alignment)

{
  Segment *pSVar1;
  size_t alignment_local;
  size_t size_local;
  BumpAllocator *this_local;
  
  if (size < 0x801) {
    pSVar1 = allocSegment(this->head,0x1000);
    this->head = pSVar1;
    this->endPtr = (byte *)(this->head + 0x100);
    this_local = (BumpAllocator *)allocate(this,size,alignment);
  }
  else {
    pSVar1 = allocSegment(this->head->prev,
                          ((size + alignment) - 1 & (alignment - 1 ^ 0xffffffffffffffff)) + 0x10);
    this->head->prev = pSVar1;
    this_local = (BumpAllocator *)alignPtr(this->head->prev->current,alignment);
  }
  return (byte *)this_local;
}

Assistant:

byte* BumpAllocator::allocateSlow(size_t size, size_t alignment) {
    // for really large allocations, give them their own segment
    if (size > (SEGMENT_SIZE >> 1)) {
        size = (size + alignment - 1) & ~(alignment - 1);
        head->prev = allocSegment(head->prev, size + sizeof(Segment));
        return alignPtr(head->prev->current, alignment);
    }

    // otherwise, start a new block
    head = allocSegment(head, SEGMENT_SIZE);
    endPtr = (byte*)head + SEGMENT_SIZE;
    return allocate(size, alignment);
}